

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O1

void __thiscall
google::protobuf::internal::InternalMetadata::
DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(InternalMetadata *this)

{
  ulong uVar1;
  pointer pUVar2;
  undefined8 *puVar3;
  void *pvVar4;
  
  uVar1 = this->ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  if ((puVar3 == (undefined8 *)0x0) &&
     (pvVar4 = (void *)(uVar1 & 0xfffffffffffffffc), pvVar4 != (void *)0x0)) {
    if (*(long *)((long)pvVar4 + 8) != *(long *)((long)pvVar4 + 0x10)) {
      UnknownFieldSet::ClearFallback((UnknownFieldSet *)((long)pvVar4 + 8));
    }
    pUVar2 = (((UnknownFieldSet *)((long)pvVar4 + 8))->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pUVar2 != (pointer)0x0) {
      operator_delete(pUVar2);
    }
    operator_delete(pvVar4);
    return;
  }
  return;
}

Assistant:

PROTOBUF_ALWAYS_INLINE bool HasUnknownFieldsTag() const {
    return ptr_ & kUnknownFieldsTagMask;
  }